

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O0

void __thiscall
sc_core::sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0>::~sc_signal_t
          (sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0> *this,void **vtt)

{
  sc_signal_inout_if<sc_dt::sc_logic> *in_RSI;
  long in_RDI;
  sc_signal_channel *in_stack_ffffffffffffffe0;
  void **in_stack_ffffffffffffffe8;
  
  sc_dt::sc_logic::~sc_logic((sc_logic *)(in_RDI + 0xbc));
  sc_dt::sc_logic::~sc_logic((sc_logic *)(in_RDI + 0xb8));
  sc_writer_policy_check<(sc_core::sc_writer_policy)0>::~sc_writer_policy_check
            ((sc_writer_policy_check<(sc_core::sc_writer_policy)0> *)0x234084);
  sc_signal_channel::~sc_signal_channel(in_stack_ffffffffffffffe0);
  sc_signal_inout_if<sc_dt::sc_logic>::~sc_signal_inout_if(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

virtual ~sc_signal_t() {}